

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

void __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::ClearStackOnExit::~ClearStackOnExit(ClearStackOnExit *this)

{
  ClearStack(this->d_);
  return;
}

Assistant:

~ClearStackOnExit() { d_.ClearStack(); }